

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# credits.c
# Opt level: O3

void init_credits(void)

{
  CREDIT_NAME **ppCVar1;
  CREDIT_NAME *pCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  ushort **ppuVar9;
  undefined8 *puVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  CREDIT_NAME *pCVar14;
  int iVar15;
  char *pcVar16;
  undefined8 *puVar17;
  ulong uVar18;
  byte bVar19;
  undefined8 *puVar20;
  undefined1 *puVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  byte *pbVar25;
  byte *pbVar26;
  CREDIT_NAME **ppCVar27;
  bool bVar28;
  README_SECTION sect [1];
  char buf [256];
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  char *local_158;
  char *pcStack_150;
  long local_148;
  CREDIT_NAME *local_140;
  byte local_138;
  byte local_137 [263];
  
  text_char = 0xffff;
  text_pix = 0;
  text_scroll = 0;
  cred = (CREDIT_NAME *)0x0;
  credit_width = 0;
  credit_scroll = 0;
  credit_age = 0;
  local_158 = (char *)0x0;
  pcStack_150 = "Introduction";
  local_168 = 0;
  uStack_164 = 0;
  uStack_160 = 0;
  uStack_15c = 0;
  uVar3 = al_ustr_newf("%s/readme.txt",data_path);
  uVar4 = al_cstr(uVar3);
  lVar5 = al_fopen(uVar4,"r");
  al_ustr_free(uVar3);
  if (lVar5 == 0) {
    title_text = "Can\'t find readme.txt, so this scroller is empty.                ";
    title_size = 0x41;
    title_alloced = 0;
  }
  else {
    lVar6 = al_fgets(lVar5,&local_138,0x100);
    if (lVar6 != 0) {
      bVar28 = true;
      puVar20 = (undefined8 *)0x0;
      do {
        bVar19 = local_138;
        pbVar26 = &local_138;
        if (local_138 == 0x3d) {
          pcVar7 = strchr((char *)pbVar26,0x20);
          if (pcVar7 != (char *)0x0) {
            sVar8 = strlen(pcVar7);
            ppuVar9 = __ctype_b_loc();
            iVar15 = (int)sVar8 + -1;
            if ((pcVar7[iVar15] == 0x3d) || (((*ppuVar9)[(byte)pcVar7[iVar15]] & 0x2000) != 0)) {
              pcVar16 = pcVar7 + iVar15;
              iVar15 = (int)sVar8 + -2;
              do {
                do {
                  *pcVar16 = '\0';
                  pcVar16 = pcVar7 + iVar15;
                  lVar6 = (long)iVar15;
                  iVar15 = iVar15 + -1;
                } while (pcVar7[lVar6] == 0x3d);
              } while (((*ppuVar9)[(byte)pcVar7[lVar6]] & 0x2000) != 0);
            }
            iVar15 = my_stricmp(pcVar7 + 1,pcStack_150);
            puVar20 = (undefined8 *)0x0;
            if (iVar15 == 0) {
              puVar20 = (undefined8 *)&local_168;
            }
LAB_0010819e:
            bVar28 = true;
          }
        }
        else if (puVar20 == (undefined8 *)0x0) {
          puVar20 = (undefined8 *)0x0;
        }
        else {
          if (local_138 == 0) {
            bVar19 = 0;
          }
          else {
            ppuVar9 = __ctype_b_loc();
            do {
              if ((*(byte *)((long)*ppuVar9 + (ulong)bVar19 * 2 + 1) & 0x20) == 0)
              goto LAB_00108161;
              bVar19 = pbVar26[1];
              pbVar26 = pbVar26 + 1;
            } while (bVar19 != 0);
            bVar19 = 0;
          }
LAB_00108161:
          sVar8 = strlen((char *)pbVar26);
          if (-1 < (int)sVar8 + -1) {
            ppuVar9 = __ctype_b_loc();
            do {
              uVar22 = (int)sVar8 - 1;
              sVar8 = (size_t)uVar22;
              if ((*(byte *)((long)*ppuVar9 + (long)(char)pbVar26[sVar8] * 2 + 1) & 0x20) == 0)
              break;
              pbVar26[sVar8] = 0;
            } while (0 < (int)uVar22);
            bVar19 = *pbVar26;
          }
          if ((bVar19 == 0) && (bVar28)) goto LAB_0010819e;
          puVar10 = (undefined8 *)malloc(0x10);
          puVar10[1] = 0;
          sVar8 = strlen((char *)pbVar26);
          pcVar7 = (char *)malloc(sVar8 + 1);
          *puVar10 = pcVar7;
          strcpy(pcVar7,(char *)pbVar26);
          puVar17 = (undefined8 *)(puVar20[1] + 8);
          if (puVar20[1] == 0) {
            puVar17 = puVar20;
          }
          *puVar17 = puVar10;
          puVar20[1] = puVar10;
          bVar28 = *pbVar26 == 0;
        }
        lVar6 = al_fgets(lVar5,&local_138,0x100);
      } while (lVar6 != 0);
    }
    al_fclose(lVar5);
    sVar8 = strlen(load_text_intro_msg);
    iVar15 = (int)sVar8;
    puVar20 = (undefined8 *)CONCAT44(uStack_164,local_168);
    pcVar7 = local_158;
    if (puVar20 != (undefined8 *)0x0) {
      iVar24 = 0;
      puVar17 = puVar20;
      title_size = iVar15;
      do {
        puVar21 = (undefined1 *)*puVar17;
        if (*puVar21 == '\0') {
          puVar21 = load_text_splitter;
        }
        sVar8 = strlen(puVar21);
        iVar23 = iVar24 + (int)sVar8;
        iVar24 = iVar23 + 1;
        puVar17 = (undefined8 *)puVar17[1];
      } while (puVar17 != (undefined8 *)0x0);
      pcVar7 = (char *)malloc((long)(iVar23 + 2));
      *pcVar7 = '\0';
      puVar17 = puVar20;
      do {
        puVar21 = (undefined1 *)*puVar17;
        if (*puVar21 == '\0') {
          puVar21 = load_text_splitter;
        }
        strcat(pcVar7,puVar21);
        sVar8 = strlen(pcVar7);
        (pcVar7 + sVar8)[0] = ' ';
        (pcVar7 + sVar8)[1] = '\0';
        puVar17 = (undefined8 *)puVar17[1];
      } while (puVar17 != (undefined8 *)0x0);
      local_158 = pcVar7;
      sVar8 = strlen(pcVar7);
      sVar11 = strlen(pcStack_150);
      sVar12 = strlen(load_text_splitter);
      sVar13 = strlen(load_text_marker);
      iVar15 = iVar15 + (int)sVar12 + (int)sVar8 + (int)sVar11 + (int)sVar13 * 2 + 2;
    }
    title_size = iVar15;
    pcVar16 = (char *)malloc((long)(iVar15 + 1));
    title_alloced = 1;
    title_text = pcVar16;
    strcpy(pcVar16,load_text_intro_msg);
    if (pcVar7 != (char *)0x0) {
      strcat(pcVar16,load_text_marker);
      sVar8 = strlen(pcVar16);
      (pcVar16 + sVar8)[0] = ' ';
      (pcVar16 + sVar8)[1] = '\0';
      strcat(pcVar16,pcStack_150);
      sVar8 = strlen(pcVar16);
      (pcVar16 + sVar8)[0] = ' ';
      (pcVar16 + sVar8)[1] = '\0';
      strcat(pcVar16,load_text_marker);
      strcat(pcVar16,load_text_splitter);
      strcat(pcVar16,pcVar7);
    }
    while (puVar20 != (undefined8 *)0x0) {
      free((void *)*puVar20);
      puVar17 = (undefined8 *)puVar20[1];
      free(puVar20);
      pcVar7 = local_158;
      puVar20 = puVar17;
    }
    if (pcVar7 != (char *)0x0) {
      free(pcVar7);
    }
  }
  uVar3 = al_ustr_newf("%s/%s",data_path,"thanks.txt");
  uVar4 = al_cstr(uVar3);
  lVar5 = al_fopen(uVar4,"r");
  al_ustr_free(uVar3);
  if (lVar5 != 0) {
    lVar6 = al_fgets(lVar5,&local_138,0x100);
    if (lVar6 != 0) {
      pCVar14 = (CREDIT_NAME *)0x0;
      local_148 = lVar5;
LAB_0010846e:
      iVar15 = my_stricmp((char *)&local_138,"Thanks!");
      if (iVar15 != 0) {
        while (pcVar7 = strstr((char *)&local_138,"&lt"), pcVar7 != (char *)0x0) {
          *pcVar7 = '<';
          sVar8 = strlen(pcVar7 + 2);
          memmove(pcVar7 + 1,pcVar7 + 3,sVar8);
        }
        while (local_140 = pCVar14, pcVar7 = strstr((char *)&local_138,"&gt"), bVar19 = local_138,
              pcVar7 != (char *)0x0) {
          *pcVar7 = '>';
          sVar8 = strlen(pcVar7 + 2);
          memmove(pcVar7 + 1,pcVar7 + 3,sVar8);
          pCVar14 = local_140;
        }
        pbVar26 = &local_138;
        if (local_138 == 0) {
          bVar28 = true;
          pbVar25 = &local_138;
        }
        else {
          ppuVar9 = __ctype_b_loc();
          do {
            pbVar25 = pbVar26;
            if ((*(byte *)((long)*ppuVar9 + (ulong)bVar19 * 2 + 1) & 0x20) == 0) goto LAB_00108540;
            bVar19 = pbVar26[1];
            pbVar26 = pbVar26 + 1;
          } while (bVar19 != 0);
          bVar28 = true;
          pbVar25 = pbVar26;
        }
        goto LAB_00108565;
      }
    }
LAB_001086cc:
    al_fclose(lVar5);
    if (credits != (CREDIT_NAME *)0x0) {
      bVar28 = true;
      pCVar14 = credits;
      ppCVar27 = &credits;
LAB_001086ef:
      do {
        if (pCVar14->next != (CREDIT_NAME *)0x0) {
          iVar15 = my_stricmp(pCVar14->name,pCVar14->next->name);
          if (0 < iVar15) {
            pCVar2 = pCVar14->next;
            *ppCVar27 = pCVar2;
            pCVar14->next = pCVar2->next;
            (*ppCVar27)->next = pCVar14;
            pCVar14 = *ppCVar27;
            bVar28 = false;
          }
          ppCVar1 = &pCVar14->next;
          ppCVar27 = &pCVar14->next;
          pCVar14 = *ppCVar1;
          if (*ppCVar1 != (CREDIT_NAME *)0x0) goto LAB_001086ef;
        }
        if (bVar28) {
          return;
        }
        bVar28 = true;
        pCVar14 = credits;
        ppCVar27 = &credits;
        if (credits == (CREDIT_NAME *)0x0) {
          return;
        }
      } while( true );
    }
  }
  return;
  while (pbVar25 = pbVar25 + 1, bVar19 != 0) {
LAB_00108540:
    uVar18 = (ulong)bVar19;
    bVar19 = pbVar25[1];
    if (((*(byte *)((long)*ppuVar9 + uVar18 * 2 + 1) & 0x20) != 0) && (bVar19 == 0x28)) break;
  }
  bVar28 = false;
LAB_00108565:
  iVar15 = strncmp((char *)pbVar25," (<email>",9);
  pCVar14 = local_140;
  if ((iVar15 == 0) || (iVar15 = strncmp((char *)pbVar25," (email",7), iVar15 == 0)) {
    *pbVar25 = 0;
    pCVar14 = (CREDIT_NAME *)malloc(0x18);
    sVar8 = strlen((char *)pbVar26);
    pcVar7 = (char *)malloc(sVar8 + 1);
    pCVar14->name = pcVar7;
    strcpy(pcVar7,(char *)pbVar26);
    pCVar14->text = (char *)0x0;
    pCVar14->next = credits;
    credits = pCVar14;
  }
  else if (bVar28 || pCVar14 == (CREDIT_NAME *)0x0) {
    pCVar14 = (CREDIT_NAME *)0x0;
  }
  else {
    sVar8 = strlen((char *)pbVar26);
    pbVar25 = pbVar26 + (sVar8 - 1);
    if (pbVar26 < pbVar25) {
      ppuVar9 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar9 + (ulong)*pbVar25 * 2 + 1) & 0x20) == 0) break;
        *pbVar25 = 0;
        pbVar25 = pbVar25 + -1;
      } while (pbVar26 < pbVar25);
    }
    pcVar7 = pCVar14->text;
    if (pcVar7 == (char *)0x0) {
      sVar8 = strlen((char *)pbVar26);
      pcVar7 = (char *)malloc(sVar8 + 1);
      pCVar14->text = pcVar7;
      strcpy(pcVar7,(char *)pbVar26);
    }
    else {
      sVar8 = strlen(pcVar7);
      sVar11 = strlen((char *)pbVar26);
      pcVar7 = (char *)realloc(pcVar7,sVar8 + sVar11 + 2);
      pCVar14->text = pcVar7;
      sVar8 = strlen(pcVar7);
      (pcVar7 + sVar8)[0] = ' ';
      (pcVar7 + sVar8)[1] = '\0';
      strcat(pCVar14->text,(char *)pbVar26);
    }
  }
  lVar5 = local_148;
  lVar6 = al_fgets(local_148,&local_138,0x100);
  if (lVar6 == 0) goto LAB_001086cc;
  goto LAB_0010846e;
}

Assistant:

void init_credits(void)
{
   /* for the text scroller */
   text_char = 0xFFFF;
   text_width = 0;
   text_pix = 0;
   text_scroll = 0;

   /* for the credits display */
   cred = NULL;
   credit_width = 0;
   credit_scroll = 0;
   credit_age = 0;
   credit_speed = 32;
   credit_skip = 1;

   load_text();
   load_credits();
}